

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

size_t slang::ast::countMembers(SyntaxNode *syntax)

{
  SyntaxKind SVar1;
  size_t sVar2;
  SyntaxNode *in_RDI;
  SyntaxNode *in_stack_00000028;
  
  SVar1 = in_RDI->kind;
  if (SVar1 == AnsiPortList) {
    slang::syntax::SyntaxNode::as<slang::syntax::AnsiPortListSyntax>(in_RDI);
    sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::size
                      ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)0x9f13c7);
    return sVar2;
  }
  if (SVar1 != BindDirective) {
    if (SVar1 == CaseGenerate) {
LAB_009f146b:
      sVar2 = countGenMembers(in_stack_00000028);
      return sVar2;
    }
    if (SVar1 == CheckerInstantiation) {
      slang::syntax::SyntaxNode::as<slang::syntax::CheckerInstantiationSyntax>(in_RDI);
      sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::size
                        ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x9f137f)
      ;
      return sVar2 + 1;
    }
    if ((SVar1 != ClassMethodDeclaration) && (SVar1 != ClockingDeclaration)) {
      if (SVar1 == ClockingItem) {
        slang::syntax::SyntaxNode::as<slang::syntax::ClockingItemSyntax>(in_RDI);
        sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::size
                          ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)0x9f1464);
        return sVar2;
      }
      if (SVar1 == ContinuousAssign) {
        slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>(in_RDI);
        sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                          ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x9f13a3);
        return sVar2 + 1;
      }
      if (SVar1 == CoverCross) {
        return 2;
      }
      if (SVar1 == DataDeclaration) {
        slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(in_RDI);
        sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::size
                          ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9f142a);
        return sVar2;
      }
      if ((((SVar1 != DefaultClockingReference) && (SVar1 != DefaultDisableDeclaration)) &&
          (SVar1 != EnumType)) && (SVar1 != GenerateBlock)) {
        if (SVar1 == HierarchyInstantiation) {
          slang::syntax::SyntaxNode::as<slang::syntax::HierarchyInstantiationSyntax>(in_RDI);
          sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                  size((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x9f1337);
          return sVar2 + 1;
        }
        if (SVar1 == IfGenerate) goto LAB_009f146b;
        if (SVar1 != LoopGenerate) {
          if (SVar1 == ModportDeclaration) {
            slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>(in_RDI);
            sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::size
                              ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)0x9f1407);
            return sVar2;
          }
          if (SVar1 != ModuleDeclaration) {
            if (SVar1 != NetAlias) {
              if (SVar1 == NonAnsiPortList) {
                slang::syntax::SyntaxNode::as<slang::syntax::NonAnsiPortListSyntax>(in_RDI);
                sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::size
                                  ((SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)0x9f13e7
                                  );
                return sVar2;
              }
              if (SVar1 == PortDeclaration) {
                slang::syntax::SyntaxNode::as<slang::syntax::PortDeclarationSyntax>(in_RDI);
                sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::size
                                  ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9f1447)
                ;
                return sVar2;
              }
              if (SVar1 == PrimitiveInstantiation) {
                slang::syntax::SyntaxNode::as<slang::syntax::PrimitiveInstantiationSyntax>(in_RDI);
                sVar2 = slang::syntax::
                        SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::size
                                  ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *
                                   )0x9f135b);
                return sVar2 + 1;
              }
              if (SVar1 == ProgramDeclaration) {
                return 1;
              }
            }
            return 2;
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static size_t countMembers(const SyntaxNode& syntax) {
    // Note that the +1s on some of these are to make a slot for implicit
    // nets that get created to live.
    switch (syntax.kind) {
        case SyntaxKind::HierarchyInstantiation:
            return syntax.as<HierarchyInstantiationSyntax>().instances.size() + 1;
        case SyntaxKind::PrimitiveInstantiation:
            return syntax.as<PrimitiveInstantiationSyntax>().instances.size() + 1;
        case SyntaxKind::CheckerInstantiation:
            return syntax.as<CheckerInstantiationSyntax>().instances.size() + 1;
        case SyntaxKind::ContinuousAssign:
            return syntax.as<ContinuousAssignSyntax>().assignments.size() + 1;
        case SyntaxKind::AnsiPortList:
            return syntax.as<AnsiPortListSyntax>().ports.size();
        case SyntaxKind::NonAnsiPortList:
            return syntax.as<NonAnsiPortListSyntax>().ports.size();
        case SyntaxKind::ModportDeclaration:
            return syntax.as<ModportDeclarationSyntax>().items.size();
        case SyntaxKind::DataDeclaration:
            return syntax.as<DataDeclarationSyntax>().declarators.size();
        case SyntaxKind::PortDeclaration:
            return syntax.as<PortDeclarationSyntax>().declarators.size();
        case SyntaxKind::ClockingItem:
            return syntax.as<ClockingItemSyntax>().decls.size();
        case SyntaxKind::IfGenerate:
        case SyntaxKind::CaseGenerate:
            return countGenMembers(syntax);
        case SyntaxKind::BindDirective:
        case SyntaxKind::LoopGenerate:
        case SyntaxKind::GenerateBlock:
        case SyntaxKind::DefaultClockingReference:
        case SyntaxKind::DefaultDisableDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::ClassMethodDeclaration:
        case SyntaxKind::EnumType:
        case SyntaxKind::ClockingDeclaration:
            return 1;
        case SyntaxKind::SpecifyBlock:
        case SyntaxKind::CoverCross:
        case SyntaxKind::NetAlias:
            return 2;
        default:
            SLANG_UNREACHABLE;
    }
}